

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O1

dictionary_t * __thiscall deci::dictionary_t::operator=(dictionary_t *this,dictionary_t *copy)

{
  storage_t *this_00;
  size_type sVar1;
  _Hash_node_base *p_Var2;
  undefined8 uVar3;
  _Hash_node_base *p_Var4;
  __hashtable *__this;
  double dVar5;
  undefined8 local_40;
  undefined8 local_38;
  
  if (this != copy) {
    this_00 = &this->storage;
    for (p_Var4 = (this->storage)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      p_Var2 = p_Var4[2]._M_nxt;
      (*(code *)(p_Var4[1]._M_nxt)->_M_nxt[3]._M_nxt)();
      (*(code *)p_Var2->_M_nxt[3]._M_nxt)(p_Var2);
    }
    std::
    _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    sVar1 = (copy->storage)._M_h._M_element_count;
    dVar5 = ceil((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                 (double)(this->storage)._M_h._M_rehash_policy._M_max_load_factor);
    std::
    _Hashtable<deci::value_t_*,_std::pair<deci::value_t_*const,_deci::value_t_*>,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>,_std::__detail::_Select1st,_deci::value_equal_to_t,_deci::value_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::rehash(&this_00->_M_h,
             (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5);
    p_Var4 = (copy->storage)._M_h._M_before_begin._M_nxt;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      do {
        p_Var2 = p_Var4[2]._M_nxt;
        uVar3 = (*(code *)(p_Var4[1]._M_nxt)->_M_nxt[2]._M_nxt)();
        local_38 = (*(code *)p_Var2->_M_nxt[2]._M_nxt)(p_Var2);
        local_40 = uVar3;
        std::
        _Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<deci::value_t*,deci::value_t*>>
                  ((_Hashtable<deci::value_t*,std::pair<deci::value_t*const,deci::value_t*>,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>,std::__detail::_Select1st,deci::value_equal_to_t,deci::value_hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)this_00,&local_40);
        p_Var4 = p_Var4->_M_nxt;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
  }
  return this;
}

Assistant:

dictionary_t& dictionary_t::operator = (const dictionary_t& copy) {
    if (this != &copy) {
      for (auto el: this->storage) {
        el.first->Delete();
        el.second->Delete();
      }
      this->storage.clear();

      this->storage.reserve(copy.storage.size());
      for (auto el: copy.storage) {
        value_t* key = el.first->Copy();
        value_t* value = el.second->Copy();
        this->storage.insert(std::make_pair(key,value));
      }
    }
    return *this;
  }